

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

bool __thiscall QTipLabel::tipChanged(QTipLabel *this,QPoint *pos,QString *text,QObject *o)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  long in_RCX;
  bool in_SIL;
  QLabel *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::text(in_RDI);
  bVar2 = ::operator!=((QString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
  QString::~QString((QString *)0x4c1512);
  if (bVar2) {
    local_21 = true;
  }
  else if (in_RCX == *(long *)&in_RDI[1].super_QFrame.super_QWidget.field_0x18) {
    bVar2 = QRect::isNull((QRect *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    if (bVar2) {
      local_21 = false;
    }
    else {
      bVar3 = QRect::contains((QPoint *)&in_RDI[1].super_QFrame.super_QWidget.data,in_SIL);
      local_21 = (bool)((bVar3 ^ 0xff) & 1);
    }
  }
  else {
    local_21 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QTipLabel::tipChanged(const QPoint &pos, const QString &text, QObject *o)
{
    if (QTipLabel::instance->text() != text)
        return true;

    if (o != widget)
        return true;

    if (!rect.isNull())
        return !rect.contains(pos);
    else
       return false;
}